

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receive.cpp
# Opt level: O0

bool wallet::CachedTxIsTrusted
               (CWallet *wallet,CWalletTx *wtx,
               set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *trusted_parents)

{
  long lVar1;
  bool bVar2;
  isminetype iVar3;
  element_type *trusted_parents_00;
  CWalletTx *pCVar4;
  size_type sVar5;
  CWallet *in_RDX;
  CWallet *in_RSI;
  CWallet *in_RDI;
  long in_FS_OFFSET;
  CTxOut *parentOut;
  CWalletTx *parent;
  CTxIn *txin;
  vector<CTxIn,_std::allocator<CTxIn>_> *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  CWallet *in_stack_ffffffffffffff70;
  CWallet *in_stack_ffffffffffffff78;
  CWallet *this;
  byte local_71;
  bool local_31;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_stack_ffffffffffffff78,(char *)in_stack_ffffffffffffff70,
             in_stack_ffffffffffffff6c,(AnnotatedMixin<std::recursive_mutex> *)0x15af0bf);
  bVar2 = CWalletTx::isConfirmed
                    ((CWalletTx *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  if (bVar2) {
    local_31 = true;
  }
  else {
    bVar2 = CWalletTx::isBlockConflicted
                      ((CWalletTx *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    if (bVar2) {
      local_31 = false;
    }
    else {
      local_71 = 1;
      if ((in_RDI->m_spend_zero_conf_change & 1U) != 0) {
        bVar2 = CachedTxIsFromMe(in_stack_ffffffffffffff78,(CWalletTx *)in_stack_ffffffffffffff70,
                                 (isminefilter *)
                                 CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        local_71 = bVar2 ^ 0xff;
      }
      if ((local_71 & 1) == 0) {
        bVar2 = CWalletTx::InMempool
                          ((CWalletTx *)
                           CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        if (bVar2) {
          trusted_parents_00 =
               std::
               __shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
          std::vector<CTxIn,_std::allocator<CTxIn>_>::begin
                    ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffff70);
          std::vector<CTxIn,_std::allocator<CTxIn>_>::end
                    ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffff70);
          while (bVar2 = __gnu_cxx::
                         operator==<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                                   ((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                                     *)in_stack_ffffffffffffff78,
                                    (__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                                     *)in_stack_ffffffffffffff70), ((bVar2 ^ 0xffU) & 1) != 0) {
            __gnu_cxx::__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
            ::operator*((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                         *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
            this = in_RDI;
            transaction_identifier::operator_cast_to_uint256_
                      ((transaction_identifier<false> *)
                       CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
            pCVar4 = CWallet::GetWalletTx(this,(uint256 *)in_stack_ffffffffffffff78);
            if (pCVar4 == (CWalletTx *)0x0) {
              local_31 = false;
              goto LAB_015af2d0;
            }
            std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
            std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                      ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffff78,
                       (size_type)in_stack_ffffffffffffff70);
            iVar3 = CWallet::IsMine(in_stack_ffffffffffffff78,(CTxOut *)in_stack_ffffffffffffff70);
            in_stack_ffffffffffffff78 = in_RDX;
            if (iVar3 != ISMINE_SPENDABLE) {
              local_31 = false;
              goto LAB_015af2d0;
            }
            in_RDX = in_stack_ffffffffffffff78;
            CWalletTx::GetHash((CWalletTx *)
                               CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
            transaction_identifier::operator_cast_to_uint256_
                      ((transaction_identifier<false> *)
                       CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
            sVar5 = std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>::count
                              ((set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)
                               in_stack_ffffffffffffff78,(key_type *)in_stack_ffffffffffffff70);
            if (sVar5 == 0) {
              in_stack_ffffffffffffff70 = in_RDX;
              bVar2 = CachedTxIsTrusted(in_RSI,(CWalletTx *)in_RDX,
                                        (set<uint256,_std::less<uint256>,_std::allocator<uint256>_>
                                         *)trusted_parents_00);
              if (!bVar2) {
                local_31 = false;
                goto LAB_015af2d0;
              }
              in_RDX = in_stack_ffffffffffffff70;
              CWalletTx::GetHash((CWalletTx *)
                                 CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
              transaction_identifier::operator_cast_to_uint256_
                        ((transaction_identifier<false> *)
                         CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
              ::_GLOBAL__N_1::std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>::
              insert((set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)
                     in_stack_ffffffffffffff78,(value_type *)in_stack_ffffffffffffff70);
            }
            __gnu_cxx::__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
            ::operator++((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                          *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
          }
          local_31 = true;
        }
        else {
          local_31 = false;
        }
      }
      else {
        local_31 = false;
      }
    }
  }
LAB_015af2d0:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_31;
}

Assistant:

bool CachedTxIsTrusted(const CWallet& wallet, const CWalletTx& wtx, std::set<uint256>& trusted_parents)
{
    AssertLockHeld(wallet.cs_wallet);
    if (wtx.isConfirmed()) return true;
    if (wtx.isBlockConflicted()) return false;
    // using wtx's cached debit
    if (!wallet.m_spend_zero_conf_change || !CachedTxIsFromMe(wallet, wtx, ISMINE_ALL)) return false;

    // Don't trust unconfirmed transactions from us unless they are in the mempool.
    if (!wtx.InMempool()) return false;

    // Trusted if all inputs are from us and are in the mempool:
    for (const CTxIn& txin : wtx.tx->vin)
    {
        // Transactions not sent by us: not trusted
        const CWalletTx* parent = wallet.GetWalletTx(txin.prevout.hash);
        if (parent == nullptr) return false;
        const CTxOut& parentOut = parent->tx->vout[txin.prevout.n];
        // Check that this specific input being spent is trusted
        if (wallet.IsMine(parentOut) != ISMINE_SPENDABLE) return false;
        // If we've already trusted this parent, continue
        if (trusted_parents.count(parent->GetHash())) continue;
        // Recurse to check that the parent is also trusted
        if (!CachedTxIsTrusted(wallet, *parent, trusted_parents)) return false;
        trusted_parents.insert(parent->GetHash());
    }
    return true;
}